

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::SoPlexBase<double>::setBoolParam
          (SoPlexBase<double> *this,BoolParam param,bool value,bool init)

{
  undefined7 in_register_00000009;
  Verbosity old_verbosity;
  Verbosity VVar1;
  ulong uVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  uVar2 = (ulong)param;
  if (((int)CONCAT71(in_register_00000009,init) == 0) &&
     (this->_currentSettings->_boolParamValues[uVar2] == value)) {
    return true;
  }
  switch(uVar2) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x19:
    break;
  case 8:
    (this->_ratiotesterBoundFlipping).super_SPxFastRT<double>.field_0x52 = value;
    break;
  case 10:
    (this->_solver).fullPerturbation = value;
    break;
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    if (this->_currentSettings->_boolParamValues[uVar2] == value) break;
    VVar1 = (this->spxout).m_verbosity;
    if ((int)VVar1 < 3) {
      return false;
    }
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3],"Changing Parameter ",0x13);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,(&Settings::boolParam)[uVar2 * 4],
               *(long *)(&DAT_003b7128 + uVar2 * 0x20) + (&Settings::boolParam)[uVar2 * 4]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],(char *)local_40,local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],
               " is only possible if SoPlex is build with PaPILO\n",0x31);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    goto LAB_0018cfaa;
  case 0x17:
    if (this->_currentSettings->_boolParamValues[0x17] == value) break;
    VVar1 = (this->spxout).m_verbosity;
    if ((int)VVar1 < 3) {
      return false;
    }
    (this->spxout).m_verbosity = INFO1;
    operator<<(&this->spxout,
               "Changing Parameter precision_boosting is only possible if SoPlex is build with MPFR\n"
              );
LAB_0018cfaa:
    (this->spxout).m_verbosity = VVar1;
LAB_0018cff3:
    return false;
  default:
    goto LAB_0018cff3;
  }
  this->_currentSettings->_boolParamValues[uVar2] = value;
  return true;
}

Assistant:

bool SoPlexBase<R>::setBoolParam(const BoolParam param, const bool value, const bool init)
{
   assert(param >= 0);
   assert(param < SoPlexBase<R>::BOOLPARAM_COUNT);
   assert(init || _isConsistent());

   if(!init && value == boolParam(param))
      return true;

   switch(param)
   {
   case LIFTING:
      break;

   case EQTRANS:
      break;

   case TESTDUALINF:
      break;

   case RATFAC:
      break;

   case ACCEPTCYCLING:
      break;

   case RATREC:
      break;

   case POWERSCALING:
      break;

   case RATFACJUMP:
      break;

   case ROWBOUNDFLIPS:
      _ratiotesterBoundFlipping.useBoundFlipsRow(value);
      break;

   case PERSISTENTSCALING:
      break;

   case FULLPERTURBATION:
      _solver.useFullPerturbation(value);
      break;

   case ENSURERAY:
      break;

   case FORCEBASIC:
      break;

#ifdef SOPLEX_WITH_PAPILO

   case SIMPLIFIER_SINGLETONCOLS:
      _simplifierPaPILO.setEnableSingletonCols(value);
      break;

   case SIMPLIFIER_CONSTRAINTPROPAGATION:
      _simplifierPaPILO.setEnablePropagation(value);
      break;

   case SIMPLIFIER_PARALLELROWDETECTION:
      _simplifierPaPILO.setEnableParallelRows(value);
      break;

   case SIMPLIFIER_PARALLELCOLDETECTION:
      _simplifierPaPILO.setEnableParallelCols(value);
      break;

   case SIMPLIFIER_SINGLETONSTUFFING:
      _simplifierPaPILO.setEnableStuffing(value);
      break;

   case SIMPLIFIER_DUALFIX:
      _simplifierPaPILO.setEnableDualFix(value);
      break;

   case SIMPLIFIER_FIXCONTINUOUS:
      _simplifierPaPILO.setEnableFixContinuous(value);
      break;

   case SIMPLIFIER_DOMINATEDCOLS:
      _simplifierPaPILO.setEnableDomCols(value);
      break;
#else

   case SIMPLIFIER_SINGLETONCOLS:
   case SIMPLIFIER_CONSTRAINTPROPAGATION:
   case SIMPLIFIER_PARALLELROWDETECTION:
   case SIMPLIFIER_PARALLELCOLDETECTION:
   case SIMPLIFIER_SINGLETONSTUFFING:
   case SIMPLIFIER_DUALFIX:
   case SIMPLIFIER_FIXCONTINUOUS:
   case SIMPLIFIER_DOMINATEDCOLS:
      if(_currentSettings->_boolParamValues[param] != value)
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Changing Parameter " << _currentSettings->boolParam.name[param] <<
                       " is only possible if SoPlex is build with PaPILO\n");
         return false;
      }

      break;
#endif

   case ITERATIVE_REFINEMENT:
      break;

   case ADAPT_TOLS_TO_MULTIPRECISION:
      break;

   case PRECISION_BOOSTING:
#ifndef SOPLEX_WITH_MPFR
      if(_currentSettings->_boolParamValues[param] != value)
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Changing Parameter precision_boosting is only possible if SoPlex is build with MPFR\n");
         return false;
      }

#endif
      break;

   case BOOSTED_WARM_START:
      break;

   case RECOVERY_MECHANISM:
      break;

   default:
      return false;
   }

   _currentSettings->_boolParamValues[param] = value;
   return true;
}